

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeApplyFromText(char *buf,ImGuiDataType data_type,void *p_data,char *format)

{
  bool bVar1;
  int iVar2;
  undefined2 *in_RDX;
  ImGuiDataType in_ESI;
  char *in_RDI;
  int v32;
  char format_sanitized [32];
  ImGuiDataTypeTempStorage data_backup;
  ImGuiDataTypeInfo *type_info;
  undefined2 *local_78;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined1 local_38 [8];
  ImGuiDataTypeInfo *local_30;
  char *local_28;
  undefined2 *local_20;
  ImGuiDataType local_14;
  char *local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  while (bVar1 = ImCharIsBlankA(*local_10), bVar1) {
    local_10 = local_10 + 1;
  }
  if (*local_10 == '\0') {
    local_1 = false;
  }
  else {
    local_30 = DataTypeGetInfo(local_14);
    memcpy(local_38,local_20,local_30->Size);
    if ((local_14 == 8) || (local_14 == 9)) {
      local_28 = local_30->ScanFmt;
    }
    else {
      local_28 = ImParseFormatSanitizeForScanning
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    iVar3 = 0;
    if (local_30->Size < 4) {
      local_78 = (undefined2 *)&stack0xffffffffffffffa4;
    }
    else {
      local_78 = local_20;
    }
    iVar2 = __isoc99_sscanf(local_10,local_28,local_78);
    if (iVar2 < 1) {
      local_1 = false;
    }
    else {
      if (local_30->Size < 4) {
        if (local_14 == 0) {
          iVar3 = ImClamp<int>(iVar3,-0x80,0x7f);
          *(char *)local_20 = (char)iVar3;
        }
        else if (local_14 == 1) {
          iVar3 = ImClamp<int>(iVar3,0,0xff);
          *(char *)local_20 = (char)iVar3;
        }
        else if (local_14 == 2) {
          iVar3 = ImClamp<int>(iVar3,-0x8000,0x7fff);
          *local_20 = (short)iVar3;
        }
        else if (local_14 == 3) {
          iVar3 = ImClamp<int>(iVar3,0,0xffff);
          *local_20 = (short)iVar3;
        }
      }
      iVar3 = memcmp(local_38,local_20,local_30->Size);
      local_1 = iVar3 != 0;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DataTypeApplyFromText(const char* buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    // Sanitize format
    // For float/double we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in, so force them into %f and %lf
    char format_sanitized[32];
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        format = type_info->ScanFmt;
    else
        format = ImParseFormatSanitizeForScanning(format, format_sanitized, IM_ARRAYSIZE(format_sanitized));

    // Small types need a 32-bit buffer to receive the result from scanf()
    int v32 = 0;
    if (sscanf(buf, format, type_info->Size >= 4 ? p_data : &v32) < 1)
        return false;
    if (type_info->Size < 4)
    {
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}